

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

string * tinygltf::GetBaseDir(string *__return_storage_ptr__,string *filepath)

{
  long lVar1;
  
  lVar1 = std::__cxx11::string::find_last_of((char *)filepath,0x16220f,0xffffffffffffffff);
  if (lVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::find_last_of((char *)filepath,0x16220f,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filepath);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GetBaseDir(const std::string &filepath) {
  if (filepath.find_last_of("/\\") != std::string::npos)
    return filepath.substr(0, filepath.find_last_of("/\\") + 1);
  return "";
}